

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O0

void sylvan_gc_WRAP(WorkerP *w,Task *__dq_head,TD_sylvan_gc *t)

{
  TD_sylvan_gc *t_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  sylvan_gc_CALL(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_IMPL_0(sylvan_gc)
{
    if (gc_enabled) {
        int zero = 0;
        if (atomic_compare_exchange_strong(&gc, &zero, 1)) {
            NEWFRAME(sylvan_gc_go);
            gc = 0;
        } else {
            /* wait for new frame to appear */
            while (atomic_load_explicit(&lace_newframe.t, memory_order_relaxed) == 0) {}
            lace_yield(__lace_worker, __lace_dq_head);
        }
    }
}